

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O0

int CfdSplitSchnorrSignature(void *handle,char *signature,char **nonce,char **key)

{
  undefined1 uVar1;
  undefined8 uVar2;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  char *in_RSI;
  CfdException *except;
  exception *std_except;
  SchnorrSignature sig;
  char *work_key;
  char *work_nonce;
  int result;
  string *in_stack_fffffffffffffdc0;
  undefined8 in_stack_fffffffffffffdc8;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffdd0;
  undefined7 in_stack_fffffffffffffe10;
  Privkey local_1d8;
  string local_1b8;
  SchnorrPubkey local_198;
  string local_180;
  allocator local_159;
  string local_158;
  SchnorrSignature local_138;
  undefined1 local_10a;
  allocator local_109;
  string local_108 [32];
  CfdSourceLocation local_e8;
  undefined1 local_ca;
  allocator local_c9;
  string local_c8 [32];
  CfdSourceLocation local_a8;
  undefined1 local_8a;
  allocator local_89;
  string local_88 [32];
  CfdSourceLocation local_68;
  char *local_40;
  char *local_38;
  undefined4 local_2c;
  undefined8 *local_28;
  undefined8 *local_20;
  char *local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffdc8 >> 0x20);
  local_2c = 0xffffffff;
  local_38 = (char *)0x0;
  local_40 = (char *)0x0;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  uVar1 = cfd::capi::IsEmptyString(local_18);
  if ((bool)uVar1) {
    local_68.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_68.filename = local_68.filename + 1;
    local_68.line = 0x35f;
    local_68.funcname = "CfdSplitSchnorrSignature";
    cfd::core::logger::warn<>(&local_68,"signature is null or empty.");
    local_8a = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_88,"Failed to parameter. signature is null or empty.",&local_89);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffdd0,error_code,in_stack_fffffffffffffdc0);
    local_8a = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (local_20 == (undefined8 *)0x0) {
    local_a8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_a8.filename = local_a8.filename + 1;
    local_a8.line = 0x365;
    local_a8.funcname = "CfdSplitSchnorrSignature";
    cfd::core::logger::warn<>(&local_a8,"nonce is null.");
    local_ca = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"Failed to parameter. nonce is null.",&local_c9);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffdd0,error_code,in_stack_fffffffffffffdc0);
    local_ca = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (local_28 == (undefined8 *)0x0) {
    local_e8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_e8.filename = local_e8.filename + 1;
    local_e8.line = 0x36b;
    local_e8.funcname = "CfdSplitSchnorrSignature";
    cfd::core::logger::warn<>(&local_e8,"key is null.");
    local_10a = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,"Failed to parameter. key is null.",&local_109);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffdd0,error_code,in_stack_fffffffffffffdc0);
    local_10a = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_158,local_18,&local_159);
  cfd::core::SchnorrSignature::SchnorrSignature(&local_138,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  cfd::core::SchnorrSignature::GetNonce(&local_198,&local_138);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_180,&local_198);
  local_38 = cfd::capi::CreateString((string *)CONCAT17(uVar1,in_stack_fffffffffffffe10));
  std::__cxx11::string::~string((string *)&local_180);
  cfd::core::SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)0x5d3b01);
  cfd::core::SchnorrSignature::GetPrivkey(&local_1d8,&local_138);
  cfd::core::Privkey::GetHex_abi_cxx11_(&local_1b8,&local_1d8);
  local_40 = cfd::capi::CreateString((string *)CONCAT17(uVar1,in_stack_fffffffffffffe10));
  std::__cxx11::string::~string((string *)&local_1b8);
  cfd::core::Privkey::~Privkey((Privkey *)0x5d3b6a);
  *local_20 = local_38;
  *local_28 = local_40;
  local_4 = 0;
  cfd::core::SchnorrSignature::~SchnorrSignature((SchnorrSignature *)0x5d3ba8);
  return local_4;
}

Assistant:

int CfdSplitSchnorrSignature(
    void* handle, const char* signature, char** nonce, char** key) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_nonce = nullptr;
  char* work_key = nullptr;
  try {
    cfd::Initialize();
    if (IsEmptyString(signature)) {
      warn(CFD_LOG_SOURCE, "signature is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. signature is null or empty.");
    }
    if (nonce == nullptr) {
      warn(CFD_LOG_SOURCE, "nonce is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. nonce is null.");
    }
    if (key == nullptr) {
      warn(CFD_LOG_SOURCE, "key is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. key is null.");
    }

    SchnorrSignature sig = SchnorrSignature(std::string(signature));
    work_nonce = CreateString(sig.GetNonce().GetHex());
    work_key = CreateString(sig.GetPrivkey().GetHex());

    *nonce = work_nonce;
    *key = work_key;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_nonce, &work_key);
  return result;
}